

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::BlendTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BlendTestInstance *this)

{
  VkSemaphore *pVVar1;
  VkResult VVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  Handle<(vk::HandleType)6> *pHVar5;
  undefined4 local_78 [2];
  VkSubmitInfo submitInfo;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  BlendTestInstance *this_local;
  
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  submitInfo.pSignalSemaphores =
       (VkSemaphore *)Context::getUniversalQueue((this->super_TestInstance).m_context);
  memset(local_78,0,0x48);
  local_78[0] = 4;
  submitInfo.pWaitDstStageMask._0_4_ = 1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x14])(pDVar3,pVVar4,1,pHVar5);
  ::vk::checkResult(VVar2,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x310);
  pVVar1 = submitInfo.pSignalSemaphores;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,pVVar1,1,local_78,pHVar5->m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x311);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x16])(pDVar3,pVVar4,1,pHVar5,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x312);
  verifyImage(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BlendTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return verifyImage();
}